

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

void embree::setAffinity(ssize_t affinity)

{
  pthread_t __th;
  ulong in_RDI;
  size_t __cpu;
  size_t threadID;
  cpu_set_t cset;
  cpu_set_t local_88;
  ulong local_8;
  
  local_8 = in_RDI;
  memset(&local_88,0,0x80);
  if (local_8 >> 3 < 0x80) {
    local_88.__bits[local_8 >> 6] = 1L << ((byte)local_8 & 0x3f) | local_88.__bits[local_8 >> 6];
  }
  __th = pthread_self();
  pthread_setaffinity_np(__th,0x80,&local_88);
  return;
}

Assistant:

void setAffinity(ssize_t affinity)
  {
    cpu_set_t cset;
    CPU_ZERO(&cset);
    //size_t threadID = mapThreadID(affinity); // this is not working properly in LXC containers when some processors are disabled
    size_t threadID = affinity;
    CPU_SET(threadID, &cset);

    pthread_setaffinity_np(pthread_self(), sizeof(cset), &cset);
  }